

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O2

void __thiscall QFbScreen::addWindow(QFbScreen *this,QFbWindow *window)

{
  long lVar1;
  QFbBackingStore *pQVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  QWindow *pQVar6;
  ulong i;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QFbWindow_*>::prepend((QList<QFbWindow_*> *)(this + 0x20),window);
  if (*(long *)(this + 0xa8) != 0) {
    uVar3 = 0;
    do {
      i = uVar3;
      if (*(ulong *)(this + 0xa8) <= i) goto LAB_00113596;
      pQVar2 = *(QFbBackingStore **)(*(long *)(this + 0xa0) + i * 8);
      lVar4 = QPlatformBackingStore::window();
      lVar5 = QPlatformWindow::window();
      uVar3 = i + 1;
    } while (lVar4 != lVar5);
    window->mBackingStore = pQVar2;
    QList<QFbBackingStore_*>::removeAt((QList<QFbBackingStore_*> *)(this + 0x98),i);
  }
LAB_00113596:
  (**(code **)(*(long *)window + 0x30))(window);
  (**(code **)(*(long *)this + 0xd0))(this);
  pQVar6 = topWindow(this);
  QWindowSystemInterface::handleFocusWindowChanged<QWindowSystemInterface::DefaultDelivery>
            (pQVar6,7);
  (**(code **)(*(long *)this + 0xb8))(this,pQVar6);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbScreen::addWindow(QFbWindow *window)
{
    mWindowStack.prepend(window);
    if (!mPendingBackingStores.isEmpty()) {
        //check if we have a backing store for this window
        for (int i = 0; i < mPendingBackingStores.size(); ++i) {
            QFbBackingStore *bs = mPendingBackingStores.at(i);
            // this gets called during QWindow::create() at a point where the
            // invariant (window->handle()->window() == window) is broken
            if (bs->window() == window->window()) {
                window->setBackingStore(bs);
                mPendingBackingStores.removeAt(i);
                break;
            }
        }
    }
    setDirty(window->geometry());
    QWindow *w = topWindow();
    QWindowSystemInterface::handleFocusWindowChanged(w);
    topWindowChanged(w);
}